

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

void XXH64_canonicalFromHash(XXH64_canonical_t *dst,XXH64_hash_t hash)

{
  *(XXH64_hash_t *)dst->digest =
       hash >> 0x38 | (hash & 0xff000000000000) >> 0x28 | (hash & 0xff0000000000) >> 0x18 |
       (hash & 0xff00000000) >> 8 | (hash & 0xff000000) << 8 | (hash & 0xff0000) << 0x18 |
       (hash & 0xff00) << 0x28 | hash << 0x38;
  return;
}

Assistant:

static xxh_u64 XXH_swap64(xxh_u64 x)
{
    return  ((x << 56) & 0xff00000000000000ULL) |
            ((x << 40) & 0x00ff000000000000ULL) |
            ((x << 24) & 0x0000ff0000000000ULL) |
            ((x << 8)  & 0x000000ff00000000ULL) |
            ((x >> 8)  & 0x00000000ff000000ULL) |
            ((x >> 24) & 0x0000000000ff0000ULL) |
            ((x >> 40) & 0x000000000000ff00ULL) |
            ((x >> 56) & 0x00000000000000ffULL);
}